

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

LOCATION Handler::CheckCapacity(PurchasedServer *purchasedServer,VirtualMachine *vm)

{
  bool bVar1;
  VirtualMachine *in_RSI;
  PurchasedServer *in_RDI;
  bool b;
  bool a;
  LOCATION local_2c [2];
  LOCATION local_24;
  byte local_1d;
  LOCATION local_1c;
  VirtualMachine *local_18;
  PurchasedServer *local_10;
  LOCATION local_4;
  
  if ((in_RSI->nodeType & 1U) == 0) {
    local_24 = NODE_A;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_1d = CheckCapacity(in_RDI,in_RSI,&local_24);
    local_2c[0] = NODE_B;
    bVar1 = CheckCapacity(local_10,local_18,local_2c);
    if (((local_1d & 1) == 0) || (!bVar1)) {
      if ((local_1d & 1) == 0) {
        if (bVar1) {
          local_4 = NODE_B;
        }
        else {
          local_4 = NONE;
        }
      }
      else {
        local_4 = NODE_A;
      }
    }
    else {
      local_4 = ALL;
    }
  }
  else {
    local_1c = ALL;
    bVar1 = CheckCapacity(in_RDI,in_RSI,&local_1c);
    local_4 = NONE;
    if (bVar1) {
      local_4 = ALL;
    }
  }
  return local_4;
}

Assistant:

LOCATION Handler::CheckCapacity(const PurchasedServer &purchasedServer, const VirtualMachine &vm) {
    // 双节点
    if (vm.nodeType) return CheckCapacity(purchasedServer, vm, ALL) ? ALL : NONE;

    // 单节点
    bool a = CheckCapacity(purchasedServer, vm, NODE_A);
    bool b = CheckCapacity(purchasedServer, vm, NODE_B);
    if (a && b) return ALL;
    else if (a) return NODE_A;
    else if (b) return NODE_B;
    else return NONE;
}